

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O1

int Wlc_NtkAbsCore(Wlc_Ntk_t *p,Wlc_Par_t *pPars)

{
  ushort uVar1;
  Wlc_Obj_t *pWVar2;
  Abc_Cex_t *pCex;
  Vec_Int_t *pVVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Bit_t *vUnmark;
  int *piVar7;
  Vec_Bit_t *pVVar8;
  Wlc_Ntk_t *p_00;
  Vec_Int_t *vPisNew;
  Gia_Man_t *pGVar9;
  Gia_Man_t *p_01;
  Aig_Man_t *pAig;
  Vec_Int_t *pVVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  Vec_Int_t **extraout_RDX;
  Vec_Int_t **extraout_RDX_00;
  Vec_Int_t **pvFlops;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int level;
  ulong uVar22;
  char *__format;
  ulong uVar23;
  Vec_Int_t *vBlacks;
  timespec ts_1;
  Pdr_Par_t PdrPars;
  uint local_130;
  Vec_Int_t *local_120;
  uint local_118;
  int local_114;
  long local_110;
  Vec_Int_t *local_108;
  timespec local_100;
  Pdr_Par_t local_f0;
  
  iVar4 = clock_gettime(3,(timespec *)&local_f0);
  if (iVar4 < 0) {
    local_110 = 1;
  }
  else {
    lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_f0._8_8_),8);
    local_110 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_f0._0_8_ * -1000000;
  }
  local_120 = (Vec_Int_t *)0x0;
  iVar4 = ((p->iObj >> 5) + 1) - (uint)((p->iObj & 0x1fU) == 0);
  vUnmark = (Vec_Bit_t *)malloc(0x10);
  vUnmark->nSize = 0;
  vUnmark->nCap = iVar4 * 0x20;
  if (iVar4 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar4 * 4);
  }
  vUnmark->pArray = piVar7;
  vUnmark->nSize = iVar4 * 0x20;
  memset(piVar7,0,(long)iVar4 << 2);
  Pdr_ManSetDefaultParams(&local_f0);
  local_f0.fVerbose = pPars->fPdrVerbose;
  local_f0.fVeryVerbose = 0;
  if (pPars->nIterMax < 2) {
    iVar4 = -1;
    uVar19 = 1;
  }
  else {
    uVar19 = 1;
    do {
      if (pPars->fVerbose != 0) {
        printf("\nIteration %d:\n");
      }
      if (pPars->fAbs2 == 0) {
        if ((uVar19 == 1) && (pPars->nLimit < 1000000000)) {
          pVVar8 = Wlc_NtkMarkLimit(p,pPars);
          uVar6 = pVVar8->nSize;
          if (0 < (int)uVar6) {
            uVar13 = vUnmark->nSize;
            uVar12 = 0;
            if ((int)uVar13 < 1) {
              uVar13 = 0;
              uVar12 = 0;
            }
            do {
              if (uVar13 == uVar12) goto LAB_0088b9ac;
              uVar20 = uVar12 >> 5;
              uVar21 = 1 << ((byte)uVar12 & 0x1f);
              if (((uint)pVVar8->pArray[uVar20] >> (uVar12 & 0x1f) & 1) == 0) {
                vUnmark->pArray[uVar20] = vUnmark->pArray[uVar20] | uVar21;
              }
              else {
                vUnmark->pArray[uVar20] = vUnmark->pArray[uVar20] & ~uVar21;
              }
              uVar12 = uVar12 + 1;
            } while (uVar6 != uVar12);
          }
          if (pVVar8->pArray != (int *)0x0) {
            free(pVVar8->pArray);
            pVVar8->pArray = (int *)0x0;
          }
          if (pVVar8 != (Vec_Bit_t *)0x0) {
            free(pVVar8);
          }
        }
        local_114 = pPars->fVerbose;
        pVVar10 = (Vec_Int_t *)malloc(0x10);
        pVVar10->nCap = 100;
        pVVar10->nSize = 0;
        piVar7 = (int *)malloc(400);
        pVVar10->pArray = piVar7;
        local_108 = pVVar10;
        vPisNew = (Vec_Int_t *)malloc(0x10);
        vPisNew->nCap = 100;
        vPisNew->nSize = 0;
        piVar7 = (int *)malloc(400);
        vPisNew->pArray = piVar7;
        pVVar10 = (Vec_Int_t *)malloc(0x10);
        pVVar10->nCap = 100;
        pVVar10->nSize = 0;
        piVar7 = (int *)malloc(400);
        pVVar10->pArray = piVar7;
        uVar6 = p->iObj;
        iVar4 = (((int)uVar6 >> 5) + 1) - (uint)((uVar6 & 0x1f) == 0);
        pVVar8 = (Vec_Bit_t *)malloc(0x10);
        pVVar8->nSize = 0;
        uVar13 = iVar4 * 0x20;
        pVVar8->nCap = uVar13;
        if (iVar4 == 0) {
          piVar7 = (int *)0x0;
        }
        else {
          piVar7 = (int *)malloc((long)iVar4 * 4);
        }
        pVVar8->pArray = piVar7;
        pVVar8->nSize = uVar13;
        local_130 = 0;
        local_118 = uVar13;
        memset(piVar7,0,(long)iVar4 << 2);
        uVar17 = 0;
        uVar23 = 0;
        if (1 < (int)uVar6) {
          uVar22 = (ulong)local_118;
          uVar13 = p->nObjsAlloc;
          if (p->nObjsAlloc < 2) {
            uVar13 = 1;
          }
          uVar14 = 1;
          lVar16 = 0x24;
          uVar23 = 0;
          uVar17 = 0;
          local_130 = 0;
          do {
            if (uVar13 == uVar14) goto LAB_0088b930;
            if ((long)vUnmark->nSize <= (long)uVar14) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                            ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
            }
            if (((uint)vUnmark->pArray[uVar14 >> 5 & 0x7ffffff] >> ((uint)uVar14 & 0x1f) & 1) == 0)
            {
              pWVar2 = p->pObjs;
              uVar1 = *(ushort *)((long)pWVar2 + lVar16 + -0xc);
              uVar12 = uVar1 & 0x3f;
              bVar11 = (byte)uVar14;
              if (uVar12 < 0x33) {
                if ((0x1e00000000000U >> uVar12 & 1) == 0) {
                  if ((0x4180000000000U >> uVar12 & 1) == 0) {
                    if (uVar12 != 8) goto LAB_0088b367;
                    iVar5 = *(int *)((long)pWVar2 + lVar16 + -4) -
                            *(int *)(&pWVar2->field_0x0 + lVar16);
                    iVar4 = -iVar5;
                    if (0 < iVar5) {
                      iVar4 = iVar5;
                    }
                    if (pPars->nBitsMux <= iVar4 + 1) {
                      if (uVar22 <= uVar14) goto LAB_0088b9ac;
                      piVar7[uVar14 >> 5 & 0x7ffffff] =
                           piVar7[uVar14 >> 5 & 0x7ffffff] | 1 << (bVar11 & 0x1f);
                      uVar23 = (ulong)((int)uVar23 + 1);
                    }
                  }
                  else {
                    iVar5 = *(int *)((long)pWVar2 + lVar16 + -4) -
                            *(int *)(&pWVar2->field_0x0 + lVar16);
                    iVar4 = -iVar5;
                    if (0 < iVar5) {
                      iVar4 = iVar5;
                    }
                    if (pPars->nBitsAdd <= iVar4 + 1) {
                      if (uVar22 <= uVar14) goto LAB_0088b9ac;
                      piVar7[uVar14 >> 5 & 0x7ffffff] =
                           piVar7[uVar14 >> 5 & 0x7ffffff] | 1 << (bVar11 & 0x1f);
                      local_130 = local_130 + 1;
                    }
                  }
                }
                else {
                  iVar5 = *(int *)((long)pWVar2 + lVar16 + -4) -
                          *(int *)(&pWVar2->field_0x0 + lVar16);
                  iVar4 = -iVar5;
                  if (0 < iVar5) {
                    iVar4 = iVar5;
                  }
                  if (pPars->nBitsMul <= iVar4 + 1) {
                    if (uVar22 <= uVar14) {
LAB_0088b9ac:
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                                    ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
                    }
                    piVar7[uVar14 >> 5 & 0x7ffffff] =
                         piVar7[uVar14 >> 5 & 0x7ffffff] | 1 << (bVar11 & 0x1f);
                    uVar17 = (ulong)((int)uVar17 + 1);
                  }
                }
              }
              else {
LAB_0088b367:
                if ((short)uVar12 != 1 && (uVar1 & 0x3d) == 1) {
                  iVar5 = *(int *)((long)pWVar2 + lVar16 + -4) -
                          *(int *)(&pWVar2->field_0x0 + lVar16);
                  iVar4 = -iVar5;
                  if (0 < iVar5) {
                    iVar4 = iVar5;
                  }
                  if (pPars->nBitsFlop <= iVar4 + 1) {
                    if (uVar22 <= uVar14) goto LAB_0088b9ac;
                    piVar7[uVar14 >> 5 & 0x7ffffff] =
                         piVar7[uVar14 >> 5 & 0x7ffffff] | 1 << (bVar11 & 0x1f);
                  }
                }
              }
            }
            uVar14 = uVar14 + 1;
            lVar16 = lVar16 + 0x18;
          } while (uVar6 != uVar14);
        }
        if (local_114 != 0) {
          printf("Abstraction engine marked %d adds/subs, %d muls/divs, %d muxes, and %d flops to be abstracted away.\n"
                 ,(ulong)local_130,uVar17,uVar23);
        }
        Wlc_NtkCleanMarks(p);
        pVVar3 = local_108;
        if (0 < (p->vCos).nSize) {
          lVar16 = 0;
          do {
            iVar4 = (p->vCos).pArray[lVar16];
            if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_0088b930;
            Wlc_NtkAbsMarkNodes_rec(p,p->pObjs + iVar4,pVVar8,pVVar3,vPisNew,pVVar10);
            lVar16 = lVar16 + 1;
          } while (lVar16 < (p->vCos).nSize);
        }
        if (0 < pVVar10->nSize) {
          lVar16 = 0;
          do {
            lVar18 = (long)pVVar10->pArray[lVar16];
            if ((lVar18 < 1) || (p->nObjsAlloc <= pVVar10->pArray[lVar16])) goto LAB_0088b930;
            pWVar2 = p->pObjs;
            if ((undefined1  [24])((undefined1  [24])pWVar2[lVar18] & (undefined1  [24])0x3f) !=
                (undefined1  [24])0x3) {
              __assert_fail("pObj->Type == WLC_OBJ_FO",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                            ,0x156,"Wlc_Obj_t *Wlc_ObjFo2Fi(Wlc_Ntk_t *, Wlc_Obj_t *)");
            }
            uVar6 = (pWVar2[lVar18].field_10.Fanins[1] + (p->vPos).nSize) - (p->vPis).nSize;
            if (((int)uVar6 < 0) || ((p->vCos).nSize <= (int)uVar6)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar4 = (p->vCos).pArray[uVar6];
            if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_0088b930;
            Wlc_NtkAbsMarkNodes_rec(p,pWVar2 + iVar4,pVVar8,pVVar3,vPisNew,pVVar10);
            lVar16 = lVar16 + 1;
          } while (lVar16 < pVVar10->nSize);
        }
        if (1 < p->iObj) {
          iVar4 = p->nObjsAlloc;
          if (iVar4 < 2) {
            iVar4 = 1;
          }
          if (iVar4 - 1U <= p->iObj - 2U) {
LAB_0088b930:
            __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                          ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
          }
        }
        qsort(pVVar3->pArray,(long)pVVar3->nSize,4,Vec_IntSortCompare1);
        qsort(vPisNew->pArray,(long)vPisNew->nSize,4,Vec_IntSortCompare1);
        qsort(pVVar10->pArray,(long)pVVar10->nSize,4,Vec_IntSortCompare1);
        Wlc_NtkCleanMarks(p);
        if (piVar7 != (int *)0x0) {
          free(piVar7);
          pVVar8->pArray = (int *)0x0;
        }
        free(pVVar8);
        pVVar3 = local_108;
        p_00 = Wlc_NtkDupDfsAbs(p,local_108,vPisNew,pVVar10);
        if (pVVar3->pArray != (int *)0x0) {
          free(pVVar3->pArray);
          pVVar3->pArray = (int *)0x0;
        }
        free(pVVar3);
        if (pVVar10->pArray != (int *)0x0) {
          free(pVVar10->pArray);
          pVVar10->pArray = (int *)0x0;
        }
        free(pVVar10);
      }
      else {
        if (local_120 == (Vec_Int_t *)0x0) {
          local_120 = Wlc_NtkGetBlacks(p,pPars);
          pvFlops = extraout_RDX_00;
        }
        else {
          Wlc_NtkUpdateBlacks(p,pPars,&local_120,vUnmark,(Vec_Int_t *)0x0);
          pvFlops = extraout_RDX;
        }
        pVVar10 = local_120;
        p_00 = Wlc_NtkAbs2(p,local_120,pvFlops);
        vPisNew = (Vec_Int_t *)malloc(0x10);
        iVar4 = pVVar10->nSize;
        lVar16 = (long)iVar4;
        vPisNew->nSize = iVar4;
        vPisNew->nCap = iVar4;
        if (lVar16 == 0) {
          piVar7 = (int *)0x0;
        }
        else {
          piVar7 = (int *)malloc(lVar16 * 4);
        }
        vPisNew->pArray = piVar7;
        memcpy(piVar7,pVVar10->pArray,lVar16 << 2);
      }
      pGVar9 = Wlc_NtkBitBlast(p_00,(Wlc_BstPar_t *)0x0);
      iVar4 = Wlc_NtkDcFlopNum(p_00);
      p_01 = pGVar9;
      if (0 < iVar4) {
        iVar5 = Wlc_NtkCountObjBits(p,vPisNew);
        p_01 = Gia_ManPermuteInputs(pGVar9,iVar5,iVar4);
        Gia_ManStop(pGVar9);
      }
      pGVar9 = p_01;
      if (pPars->fXorOutput != 0) {
        pGVar9 = Gia_ManTransformMiter2(p_01);
        Gia_ManStop(p_01);
      }
      if (pPars->fVerbose != 0) {
        printf("Derived abstraction with %d objects and %d PPIs. Bit-blasted AIG stats are:\n",
               (ulong)(p_00->iObj - 1),(ulong)(uint)vPisNew->nSize);
        Gia_ManPrintStats(pGVar9,(Gps_Par_t *)0x0);
      }
      Wlc_NtkFree(p_00);
      pAig = Gia_ManToAigSimple(pGVar9);
      iVar4 = Pdr_ManSolve(pAig,&local_f0);
      pCex = pAig->pSeqModel;
      pAig->pSeqModel = (Abc_Cex_t *)0x0;
      Aig_ManStop(pAig);
      if (pCex == (Abc_Cex_t *)0x0) {
        if (iVar4 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs.c"
                        ,0x74a,"int Wlc_NtkAbsCore(Wlc_Ntk_t *, Wlc_Par_t *)");
        }
        Gia_ManStop(pGVar9);
        if (vPisNew->pArray != (int *)0x0) {
          free(vPisNew->pArray);
          vPisNew->pArray = (int *)0x0;
        }
        free(vPisNew);
        break;
      }
      pVVar10 = Wlc_NtkAbsRefinement(p,pGVar9,pCex,vPisNew);
      Gia_ManStop(pGVar9);
      if (vPisNew->pArray != (int *)0x0) {
        free(vPisNew->pArray);
        vPisNew->pArray = (int *)0x0;
      }
      free(vPisNew);
      if (pVVar10 == (Vec_Int_t *)0x0) {
        Abc_CexFree(pCex);
        break;
      }
      uVar6 = Wlc_NtkRemoveFromAbstraction(p,pVVar10,vUnmark);
      if (pPars->fVerbose != 0) {
        printf("Refinement of CEX in frame %d came up with %d un-abstacted PPIs, whose MFFCs include %d objects.\n"
               ,(ulong)(uint)pCex->iFrame,(ulong)(uint)pVVar10->nSize,(ulong)uVar6);
      }
      if (pVVar10->pArray != (int *)0x0) {
        free(pVVar10->pArray);
        pVVar10->pArray = (int *)0x0;
      }
      free(pVVar10);
      Abc_CexFree(pCex);
      uVar19 = uVar19 + 1;
    } while ((int)uVar19 < pPars->nIterMax);
  }
  pVVar10 = local_120;
  if (local_120->pArray != (int *)0x0) {
    free(local_120->pArray);
    pVVar10->pArray = (int *)0x0;
  }
  if (pVVar10 != (Vec_Int_t *)0x0) {
    free(pVVar10);
  }
  if (vUnmark->pArray != (int *)0x0) {
    free(vUnmark->pArray);
    vUnmark->pArray = (int *)0x0;
  }
  free(vUnmark);
  if (pPars->fVerbose != 0) {
    putchar(10);
  }
  printf("Abstraction ");
  pcVar15 = "timed out";
  if (iVar4 == 1) {
    pcVar15 = "is successfully proved";
  }
  __format = "resulted in a real CEX";
  if (iVar4 != 0) {
    __format = pcVar15;
  }
  printf(__format);
  printf(" after %d iterations. ",(ulong)uVar19);
  level = 3;
  iVar5 = clock_gettime(3,&local_100);
  if (iVar5 < 0) {
    lVar16 = -1;
  }
  else {
    lVar16 = local_100.tv_nsec / 1000 + local_100.tv_sec * 1000000;
  }
  lVar16 = lVar16 + local_110;
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)lVar16 / 1000000.0);
  return iVar4;
}

Assistant:

int Wlc_NtkAbsCore( Wlc_Ntk_t * p, Wlc_Par_t * pPars )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vBlacks = NULL;
    int nIters, nNodes, nDcFlops, RetValue = -1;
    // start the bitmap to mark objects that cannot be abstracted because of refinement
    // currently, this bitmap is empty because abstraction begins without refinement
    Vec_Bit_t * vUnmark = Vec_BitStart( Wlc_NtkObjNumMax(p) );
    // set up parameters to run PDR
    Pdr_Par_t PdrPars, * pPdrPars = &PdrPars;
    Pdr_ManSetDefaultParams( pPdrPars );
    //pPdrPars->fUseAbs    = 1;   // use 'pdr -t'  (on-the-fly abstraction)
    //pPdrPars->fCtgs      = 1;   // use 'pdr -nc' (improved generalization)
    //pPdrPars->fSkipDown  = 0;   // use 'pdr -nc' (improved generalization)
    //pPdrPars->nRestLimit = 500; // reset queue or proof-obligations when it gets larger than this
    pPdrPars->fVerbose   = pPars->fPdrVerbose;
    pPdrPars->fVeryVerbose = 0;
    // perform refinement iterations
    for ( nIters = 1; nIters < pPars->nIterMax; nIters++ )
    {
        Aig_Man_t * pAig;
        Abc_Cex_t * pCex;
        Vec_Int_t * vPisNew, * vRefine;  
        Gia_Man_t * pGia, * pTemp;
        Wlc_Ntk_t * pAbs;

        if ( pPars->fVerbose )
            printf( "\nIteration %d:\n", nIters );

        // get abstracted GIA and the set of pseudo-PIs (vPisNew)
        if ( pPars->fAbs2 )
        {
            if ( vBlacks == NULL )
                vBlacks = Wlc_NtkGetBlacks( p, pPars );
            else
                Wlc_NtkUpdateBlacks( p, pPars, &vBlacks, vUnmark, NULL );
            pAbs = Wlc_NtkAbs2( p, vBlacks, NULL );
            vPisNew = Vec_IntDup( vBlacks );
        }
        else
        {
            if ( nIters == 1 && pPars->nLimit < ABC_INFINITY )
                Wlc_NtkSetUnmark( p, pPars, vUnmark );

            pAbs = Wlc_NtkAbs( p, pPars, vUnmark, &vPisNew, NULL, pPars->fVerbose );
        }
        pGia = Wlc_NtkBitBlast( pAbs, NULL );

        // if the abstraction has flops with DC-init state,
        // new PIs were introduced by bit-blasting at the end of the PI list
        // here we move these variables to be *before* PPIs, because
        // PPIs are supposed to be at the end of the PI list for refinement
        nDcFlops = Wlc_NtkDcFlopNum(pAbs);
        if ( nDcFlops > 0 ) // DC-init flops are present
        {
            pGia = Gia_ManPermuteInputs( pTemp = pGia, Wlc_NtkCountObjBits(p, vPisNew), nDcFlops );
            Gia_ManStop( pTemp );
        }
        // if the word-level outputs have to be XORs, this is a place to do it
        if ( pPars->fXorOutput )
        {
            pGia = Gia_ManTransformMiter2( pTemp = pGia );
            Gia_ManStop( pTemp );
        }
        if ( pPars->fVerbose )
        {
            printf( "Derived abstraction with %d objects and %d PPIs. Bit-blasted AIG stats are:\n", Wlc_NtkObjNum(pAbs), Vec_IntSize(vPisNew) ); 
            Gia_ManPrintStats( pGia, NULL );
        }
        Wlc_NtkFree( pAbs );

        // try to prove abstracted GIA by converting it to AIG and calling PDR
        pAig = Gia_ManToAigSimple( pGia );
        RetValue = Pdr_ManSolve( pAig, pPdrPars );
        pCex = pAig->pSeqModel; pAig->pSeqModel = NULL;
        Aig_ManStop( pAig );

        // consider outcomes
        if ( pCex == NULL ) 
        {
            assert( RetValue ); // proved or undecided
            Gia_ManStop( pGia );
            Vec_IntFree( vPisNew );
            break;
        }

        // perform refinement
        vRefine = Wlc_NtkAbsRefinement( p, pGia, pCex, vPisNew );
        Gia_ManStop( pGia );
        Vec_IntFree( vPisNew );
        if ( vRefine == NULL ) // real CEX
        {
            Abc_CexFree( pCex ); // return CEX in the future
            break;
        }

        // update the set of objects to be un-abstracted
        nNodes = Wlc_NtkRemoveFromAbstraction( p, vRefine, vUnmark );
        if ( pPars->fVerbose )
            printf( "Refinement of CEX in frame %d came up with %d un-abstacted PPIs, whose MFFCs include %d objects.\n", pCex->iFrame, Vec_IntSize(vRefine), nNodes );
        Vec_IntFree( vRefine );
        Abc_CexFree( pCex );
    }
    Vec_IntFree( vBlacks );
    Vec_BitFree( vUnmark );
    // report the result
    if ( pPars->fVerbose )
        printf( "\n" );
    printf( "Abstraction " );
    if ( RetValue == 0 )
        printf( "resulted in a real CEX" );
    else if ( RetValue == 1 )
        printf( "is successfully proved" );
    else 
        printf( "timed out" );
    printf( " after %d iterations. ", nIters );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return RetValue;
}